

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-internal-utils.cc
# Opt level: O2

void testing::internal::IllegalDoDefault(char *file,int line)

{
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string
            ((string *)&local_38,
             "You are using DoDefault() inside a composite action like DoAll() or WithArgs().  This is not supported for technical reasons.  Please instead spell out the default action, or assign the default action to an Action variable and use the variable in various places."
             ,&local_39);
  Assert(false,file,line,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

GTEST_API_ void IllegalDoDefault(const char* file, int line) {
  internal::Assert(
      false, file, line,
      "You are using DoDefault() inside a composite action like "
      "DoAll() or WithArgs().  This is not supported for technical "
      "reasons.  Please instead spell out the default action, or "
      "assign the default action to an Action variable and use "
      "the variable in various places.");
}